

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O1

void ymf271_alloc_rom(void *info,UINT32 memsize)

{
  void *__s;
  YMF271Chip *chip;
  
  if (*(UINT32 *)((long)info + 0x2d88) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)info + 0x2d80),(ulong)memsize);
  *(void **)((long)info + 0x2d80) = __s;
  *(UINT32 *)((long)info + 0x2d88) = memsize;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void ymf271_alloc_rom(void* info, UINT32 memsize)
{
	YMF271Chip *chip = (YMF271Chip *)info;
	
	if (chip->mem_size == memsize)
		return ;
	
	chip->mem_base = (UINT8*)realloc(chip->mem_base, memsize);
	chip->mem_size = memsize;
	memset(chip->mem_base, 0xFF, memsize);
	
	return;
}